

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::Pattern::eval
          (Pattern *this,EvalContext *context,ConstantValue *value,
          CaseStatementCondition conditionKind)

{
  CaseStatementCondition *in_RDX;
  ConstantValue *in_RSI;
  EvalContext *in_RDI;
  EvalVisitor *unaff_retaddr;
  Pattern *in_stack_00000008;
  EvalVisitor visitor;
  
  visit<(anonymous_namespace)::EvalVisitor,slang::ast::EvalContext&,slang::ConstantValue_const&,slang::ast::CaseStatementCondition&>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue Pattern::eval(EvalContext& context, const ConstantValue& value,
                            CaseStatementCondition conditionKind) const {
    EvalVisitor visitor;
    return visit(visitor, context, value, conditionKind);
}